

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Float pbrt::AngleBetween<float>(Vector3<float> *v1,Vector3<float> *v2)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 extraout_var [60];
  
  uVar2._0_4_ = (v1->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2._4_4_ = (v1->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  uVar3._0_4_ = (v2->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar3._4_4_ = (v2->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar7._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar3;
  auVar7._4_4_ = (float)uVar2._4_4_ * (float)uVar3._4_4_;
  auVar7._8_8_ = 0;
  auVar7 = vmovshdup_avx(auVar7);
  auVar7 = vfmadd231ss_fma(auVar7,auVar9,auVar12);
  fVar6 = (v1->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar1 = (v2->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),ZEXT416((uint)fVar1));
  if (0.0 <= auVar7._0_4_) {
    auVar7 = vsubps_avx(auVar12,auVar9);
    auVar11._0_4_ = auVar7._0_4_ * auVar7._0_4_;
    auVar11._4_4_ = auVar7._4_4_ * auVar7._4_4_;
    auVar11._8_4_ = auVar7._8_4_ * auVar7._8_4_;
    auVar11._12_4_ = auVar7._12_4_ * auVar7._12_4_;
    auVar7 = vhaddps_avx(auVar11,auVar11);
    fVar6 = auVar7._0_4_ + (fVar1 - fVar6) * (fVar1 - fVar6);
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      auVar7 = vsqrtss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      fVar6 = auVar7._0_4_;
    }
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar6 * 0.5)));
    uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar6 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    fVar6 = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar7._0_4_));
    fVar6 = fVar6 + fVar6;
  }
  else {
    auVar10._0_4_ =
         ((float)(undefined4)uVar2 + (float)(undefined4)uVar3) *
         ((float)(undefined4)uVar2 + (float)(undefined4)uVar3);
    auVar10._4_4_ =
         ((float)uVar2._4_4_ + (float)uVar3._4_4_) * ((float)uVar2._4_4_ + (float)uVar3._4_4_);
    auVar10._8_8_ = 0;
    auVar7 = vhaddps_avx(auVar10,auVar10);
    fVar6 = auVar7._0_4_ + (fVar6 + fVar1) * (fVar6 + fVar1);
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      auVar7 = vsqrtss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      fVar6 = auVar7._0_4_;
    }
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar6 * 0.5)));
    uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar6 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar8._0_4_ = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar7._0_4_));
    auVar8._4_60_ = extraout_var;
    auVar7 = vfmadd213ss_fma(auVar8._0_16_,SUB6416(ZEXT464(0xc0000000),0),ZEXT416(0x40490fdb));
    fVar6 = auVar7._0_4_;
  }
  return fVar6;
}

Assistant:

PBRT_CPU_GPU inline Float AngleBetween(const Vector3<T> &v1, const Vector3<T> &v2) {
    if (Dot(v1, v2) < 0)
        return Pi - 2 * SafeASin(Length(v1 + v2) / 2);
    else
        return 2 * SafeASin(Length(v2 - v1) / 2);
}